

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::verifyImageResultValid
          (ClearCase *this,PixelBufferAccess *result)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  TestLog *pTVar5;
  MessageBuilder *this_00;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  LogImage local_420;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  LogImage local_340;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  LogImageSet local_260;
  MessageBuilder local_220;
  deUint32 local_9c;
  undefined1 local_98 [8];
  IVec4 pixel;
  int x;
  int y;
  PixelBufferAccess local_60;
  byte local_31;
  undefined1 local_30 [7];
  bool anyError;
  Surface errorMask;
  PixelBufferAccess *result_local;
  ClearCase *this_local;
  
  errorMask.m_pixels.m_cap = (size_t)result;
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&result->super_ConstPixelBufferAccess);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)errorMask.m_pixels.m_cap)
  ;
  tcu::Surface::Surface((Surface *)local_30,iVar2,iVar3);
  local_31 = 0;
  tcu::Surface::getAccess(&local_60,(Surface *)local_30);
  tcu::RGBA::green();
  tcu::RGBA::toIVec((RGBA *)&y);
  tcu::clear(&local_60,(IVec4 *)&y);
  pixel.m_data[3] = 0;
  do {
    iVar2 = pixel.m_data[3];
    iVar3 = tcu::ConstPixelBufferAccess::getHeight
                      ((ConstPixelBufferAccess *)errorMask.m_pixels.m_cap);
    if (iVar3 <= iVar2) {
      if ((local_31 & 1) != 0) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_220,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        this_00 = tcu::MessageBuilder::operator<<
                            (&local_220,(char (*) [27])"Image verification failed.");
        pTVar5 = tcu::MessageBuilder::operator<<
                           (this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"Images",&local_281)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"Image verification",&local_2a9);
        tcu::LogImageSet::LogImageSet(&local_260,&local_280,&local_2a8);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_260);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,"ResultImage",&local_361);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"Result image",&local_389);
        tcu::LogImage::LogImage
                  (&local_340,&local_360,&local_388,
                   (ConstPixelBufferAccess *)errorMask.m_pixels.m_cap,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_340);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"ErrorMask",&local_441);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"Error mask",&local_469);
        tcu::LogImage::LogImage
                  (&local_420,&local_440,&local_468,(Surface *)local_30,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_420);
        tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_420);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator(&local_469);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator(&local_441);
        tcu::LogImage::~LogImage(&local_340);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator(&local_389);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
        tcu::LogImageSet::~LogImageSet(&local_260);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator(&local_2a9);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        tcu::MessageBuilder::~MessageBuilder(&local_220);
      }
      bVar1 = local_31 ^ 0xff;
      tcu::Surface::~Surface((Surface *)local_30);
      return (bool)(bVar1 & 1);
    }
    pixel.m_data[2] = 0;
    while( true ) {
      iVar2 = pixel.m_data[2];
      iVar3 = tcu::ConstPixelBufferAccess::getWidth
                        ((ConstPixelBufferAccess *)errorMask.m_pixels.m_cap);
      if (iVar3 <= iVar2) break;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_98,(int)errorMask.m_pixels.m_cap,pixel.m_data[2],
                 pixel.m_data[3]);
      piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_98,1);
      if (*piVar4 == 0xff) {
        piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_98,2);
        if (*piVar4 != 0) goto LAB_0239835c;
      }
      else {
LAB_0239835c:
        iVar3 = pixel.m_data[3];
        iVar2 = pixel.m_data[2];
        local_9c = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_30,iVar2,iVar3,(RGBA)local_9c);
        local_31 = 1;
      }
      pixel.m_data[2] = pixel.m_data[2] + 1;
    }
    pixel.m_data[3] = pixel.m_data[3] + 1;
  } while( true );
}

Assistant:

bool ClearCase::verifyImageResultValid (const tcu::PixelBufferAccess& result)
{
	tcu::Surface	errorMask	(result.getWidth(), result.getHeight());
	bool			anyError	= false;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toIVec());

	for (int y = 0; y < result.getHeight(); ++y)
	for (int x = 0; x < result.getWidth(); ++x)
	{
		const tcu::IVec4 pixel = result.getPixelInt(x, y);

		// allow green, yellow and any shade between
		if (pixel[1] != 255 || pixel[2] != 0)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("ResultImage", "Result image", result)
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask)
			<< tcu::TestLog::EndImageSet;
	}

	return !anyError;
}